

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  char cVar1;
  long lVar2;
  lua_State *plVar3;
  IRRef1 IVar4;
  ushort uVar5;
  int iVar7;
  TRef TVar8;
  ulong uVar9;
  ulong uVar10;
  int32_t slot;
  long lVar11;
  TRef unaff_R12D;
  uint uVar12;
  bool bVar13;
  TRef TVar6;
  
  lVar2 = *(long *)((long)J->fn + (ulong)uv * 8 + 0x28);
  TVar6 = getcurrf(J);
  IVar4 = (IRRef1)TVar6;
  if (*(char *)(lVar2 + 0xb) == '\0') {
LAB_00133d2e:
    iVar7 = 0;
  }
  else {
    uVar9 = (long)**(ulong **)(lVar2 + 0x20) >> 0x2f;
    if ((uVar9 + 0xd < 2) || (uVar9 == 0xfffffffffffffff9)) {
      bVar13 = true;
    }
    else if (uVar9 == 0xfffffffffffffff5) {
      uVar10 = **(ulong **)(lVar2 + 0x20) & 0x7fffffffffff;
      uVar9 = 0;
      bVar13 = false;
      if ((*(byte *)(uVar10 + 8) & 0x90) == 0) {
        lVar11 = **(long **)&J[-1].penalty[0x3c].val;
        uVar9 = (ulong)*(ushort *)(uVar10 + 10);
        if (0x5fffffff < *(uint *)(lVar11 + uVar9 * 0x18)) goto LAB_00133d23;
        uVar9 = (ulong)(*(uint *)(lVar11 + uVar9 * 0x18 + 4) < 0x11);
        bVar13 = false;
      }
    }
    else {
LAB_00133d23:
      bVar13 = false;
      uVar9 = 1;
    }
    iVar7 = (int)uVar9;
    if (bVar13) goto LAB_00133d2e;
  }
  if (iVar7 == 0) goto LAB_00133db5;
  if ((short)IVar4 < 0) {
    if (J->pt->flags < 0x60) {
      TVar6 = lj_ir_kgc(J,(GCobj *)J->fn,IRT_FUNC);
      (J->fold).ins.field_0.ot = 0x888;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      lj_opt_fold(J);
      J->base[-2] = TVar6;
      goto LAB_00133d96;
    }
    bVar13 = false;
  }
  else {
LAB_00133d96:
    IVar4 = (IRRef1)TVar6;
    unaff_R12D = lj_record_constify(J,*(cTValue **)(lVar2 + 0x20));
    bVar13 = unaff_R12D != 0;
  }
  if (bVar13) {
    return unaff_R12D;
  }
LAB_00133db5:
  uVar12 = *(uint *)(lVar2 + 0x28) + 0xfb3ee249;
  iVar7 = (*(uint *)(lVar2 + 0x28) ^ uVar12) - (uVar12 * 0x4000 | uVar12 >> 0x12);
  uVar5 = ((ushort)(uVar12 >> 0xd) ^ (ushort)iVar7) - (ushort)((uint)iVar7 >> 0x13) & 0xff |
          (ushort)(uv << 8);
  cVar1 = *(char *)(lVar2 + 10);
  if (cVar1 == '\0') {
    (J->fold).ins.field_0.ot = 0x3c89;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = uVar5;
    TVar6 = lj_opt_fold(J);
    uVar9 = *(ulong *)(lVar2 + 0x20);
    plVar3 = J->L;
    IVar4 = (IRRef1)TVar6;
    if (((plVar3->stack).ptr64 <= uVar9) && (uVar9 < (plVar3->maxstack).ptr64)) {
      iVar7 = (int)(uVar9 - (long)(plVar3->base + -J->baseslot) >> 3);
      if (-1 < iVar7) {
        TVar6 = lj_ir_kint(J,iVar7 * -8 + 0x10);
        (J->fold).ins.field_0.ot = 0x2909;
        (J->fold).ins.field_0.op1 = IVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        TVar6 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x889;
        (J->fold).ins.field_0.op1 = 0x8000;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
        lj_opt_fold(J);
        lVar11 = (long)iVar7 - (long)(int)J->baseslot;
        slot = (int32_t)lVar11;
        if (val == 0) {
          unaff_R12D = J->base[lVar11];
          if (unaff_R12D == 0) {
            unaff_R12D = sload(J,slot);
          }
        }
        else {
          J->base[lVar11] = val;
          unaff_R12D = 0;
          if ((int)J->maxslot <= slot) {
            J->maxslot = slot + 1;
          }
        }
      }
      if (-1 < iVar7) {
        return unaff_R12D;
      }
    }
    (J->fold).ins.field_0.op1 = IVar4;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x2a098000;
    TVar6 = lj_opt_fold(J);
    TVar8 = lj_ir_kint(J,(J->maxslot + J->baseslot) * 8);
    (J->fold).ins.field_0.ot = 0x789;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
    lj_opt_fold(J);
  }
  else {
    (J->fold).ins.field_0.ot = 0x3d89;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = uVar5;
    TVar6 = lj_opt_fold(J);
    IVar4 = (IRRef1)TVar6;
  }
  if (val == 0) {
    uVar12 = 0xe;
    if (0xfffffffffffffff1 < (ulong)(**(long **)(lVar2 + 0x20) >> 0x2f)) {
      uVar12 = ~(uint)(**(long **)(lVar2 + 0x20) >> 0x2f);
    }
    (J->fold).ins.field_0.ot = (ushort)uVar12 | 0x4480;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = 0;
    TVar8 = lj_opt_fold(J);
    TVar6 = uVar12 * 0x1000001 ^ 0x7fff;
    if (2 < uVar12) {
      TVar6 = TVar8;
    }
  }
  else {
    if ((val >> 0x18 & 0x1f) - 0xf < 5) {
      (J->fold).ins.field_0.op1 = (IRRef1)val;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
      val = lj_opt_fold(J);
    }
    uVar12 = val >> 0x18 & 0x1f;
    (J->fold).ins.field_0.ot = (short)uVar12 + 0x4c00;
    (J->fold).ins.field_0.op1 = IVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)val;
    lj_opt_fold(J);
    if ((cVar1 != '\0') && (uVar12 - 4 < 9)) {
      (J->fold).ins.field_0.ot = 0x5900;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)val;
      lj_opt_fold(J);
    }
    J->needsnap = '\x01';
    TVar6 = 0;
  }
  return TVar6;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lj_assertJ(val == 0, "bad usage");
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
#if LJ_FR2
      J->base[-2] = kfunc;
#else
      J->base[-1] = kfunc | TREF_FRAME;
#endif
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    uref = tref_ref(emitir(IRTG(IR_UREFO, IRT_PGC), fn, uv));
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	emitir(IRTG(IR_EQ, IRT_PGC),
	       REF_BASE,
	       emitir(IRT(IR_ADD, IRT_PGC), uref,
		      lj_ir_kint(J, (slot - 1 - LJ_FR2) * -8)));
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    emitir(IRTG(IR_UGT, IRT_PGC),
	   emitir(IRT(IR_SUB, IRT_PGC), uref, REF_BASE),
	   lj_ir_kint(J, (J->baseslot + J->maxslot) * 8));
  } else {
    needbarrier = 1;
    uref = tref_ref(emitir(IRTG(IR_UREFC, IRT_PGC), fn, uv));
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}